

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

char * stringify(char *str,VARR_char *to)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  size_t sVar4;
  FILE *__stream;
  pos_t pVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  char *pcVar10;
  ulong uVar11;
  int *piVar12;
  node_t_conflict n;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  int extraout_EDX;
  VARR_char *unaff_RBX;
  VARR_char *pVVar16;
  c2m_ctx_t c2m_ctx;
  code *pcVar17;
  byte bVar18;
  char *pcVar19;
  size_t sVar20;
  VARR_char *pVVar21;
  longdouble in_ST0;
  float fVar22;
  double dVar23;
  int iStack_a4;
  int iStack_a0;
  uint uStack_9c;
  char *pcStack_98;
  int iStack_8c;
  tab_str_t tStack_78;
  VARR_char *pVStack_58;
  
  pVVar16 = to;
  c2m_ctx = (c2m_ctx_t)str;
  if ((to != (VARR_char *)0x0) &&
     (c2m_ctx = (c2m_ctx_t)to->varr, unaff_RBX = to, c2m_ctx != (c2m_ctx_t)0x0)) {
    to->els_num = 0;
    if (to->size == 0) {
      pVVar16 = (VARR_char *)&DAT_00000001;
      pcVar10 = (char *)realloc(c2m_ctx,1);
      to->varr = pcVar10;
      to->size = 1;
    }
    sVar4 = to->els_num;
    to->els_num = sVar4 + 1;
    to->varr[sVar4] = '\"';
    while( true ) {
      cVar1 = *str;
      if ((cVar1 == '\"') || (cVar1 == '\\')) {
        c2m_ctx = (c2m_ctx_t)to->varr;
        if (c2m_ctx == (c2m_ctx_t)0x0) goto LAB_00192077;
        uVar11 = to->els_num + 1;
        if (to->size < uVar11) {
          pVVar21 = (VARR_char *)((uVar11 >> 1) + uVar11);
          pVVar16 = pVVar21;
          pcVar10 = (char *)realloc(c2m_ctx,(size_t)pVVar21);
          to->varr = pcVar10;
          to->size = (size_t)pVVar21;
        }
        sVar4 = to->els_num;
        to->els_num = sVar4 + 1;
        to->varr[sVar4] = '\\';
      }
      else if (cVar1 == '\0') {
        c2m_ctx = (c2m_ctx_t)to->varr;
        if (c2m_ctx != (c2m_ctx_t)0x0) {
          uVar11 = to->els_num + 1;
          if (to->size < uVar11) {
            sVar20 = (uVar11 >> 1) + uVar11;
            pcVar10 = (char *)realloc(c2m_ctx,sVar20);
            to->varr = pcVar10;
            to->size = sVar20;
          }
          pcVar10 = (char *)to->els_num;
          to->els_num = (size_t)(pcVar10 + 1);
          to->varr[(long)pcVar10] = '\"';
          return pcVar10;
        }
        goto LAB_00192081;
      }
      c2m_ctx = (c2m_ctx_t)to->varr;
      if (c2m_ctx == (c2m_ctx_t)0x0) break;
      cVar1 = *str;
      uVar11 = to->els_num + 1;
      if (to->size < uVar11) {
        pVVar21 = (VARR_char *)((uVar11 >> 1) + uVar11);
        pVVar16 = pVVar21;
        pcVar10 = (char *)realloc(c2m_ctx,(size_t)pVVar21);
        to->varr = pcVar10;
        to->size = (size_t)pVVar21;
      }
      sVar4 = to->els_num;
      to->els_num = sVar4 + 1;
      to->varr[sVar4] = cVar1;
      str = str + 1;
    }
    stringify_cold_3();
LAB_00192077:
    stringify_cold_1();
  }
  stringify_cold_4();
LAB_00192081:
  stringify_cold_2();
  uVar3 = (uint)pVVar16->els_num;
  uVar13 = (uVar3 & 0xffff) - 0x13d;
  pVStack_58 = unaff_RBX;
  if (uVar13 < 0xb) {
    if (uVar13 == 2) {
      *(uint *)&pVVar16->els_num = uVar3 & 0xffff0103;
    }
    else if ((0x7f3U >> (uVar13 & 0x1f) & 1) != 0) {
      __assert_fail("t->code != T_HEADER && t->code != T_BOA && t->code != T_EOA && t->code != T_EOR && t->code != T_EOP && t->code != T_EOFILE && t->code != T_EOU && t->code != T_PLM && t->code != T_RDBLNO"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x732,"token_t pptoken2token(c2m_ctx_t, token_t, int)");
    }
  }
  iVar14 = (int)pVVar16->els_num << 0x10;
  if (extraout_EDX != 0 && iVar14 == 0x1030000) {
    pcVar10 = pVVar16[1].varr;
    sVar20 = strlen(pcVar10);
    str_add(&tStack_78,c2m_ctx,pcVar10,sVar20 + 1,0x102,0,0);
    if (tStack_78.key == 0x102) {
      return (char *)pVVar16;
    }
    *(short *)&pVVar16->els_num = (short)tStack_78.key;
    *(undefined4 *)&pVVar16[1].els_num = 0;
    pVVar16[1].size = 0;
    return (char *)pVVar16;
  }
  if (iVar14 == 0xa0000) {
    return (char *)0x0;
  }
  if (iVar14 == 0x200000) {
    return (char *)0x0;
  }
  if (iVar14 != 0x1000000) {
    return (char *)pVVar16;
  }
  pcVar10 = pVVar16[1].varr;
  sVar20 = strlen(pcVar10);
  iVar14 = (int)sVar20;
  if (iVar14 < 1) {
    __assert_fail("last >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x746,"token_t pptoken2token(c2m_ctx_t, token_t, int)");
  }
  pcStack_98 = pcVar10;
  if (*pcVar10 == '0') {
    if ((byte)(pcVar10[1] | 0x20U) == 0x78) {
      iStack_8c = 0x10;
      bVar6 = true;
      bVar18 = 0;
    }
    else {
      bVar18 = 1;
      if ((byte)(pcVar10[1] | 0x20U) != 0x62) {
        iStack_8c = 8;
        goto LAB_001921b0;
      }
      pcVar17 = error;
      if (c2m_ctx->options->pedantic_p == 0) {
        pcVar17 = warning;
      }
      bVar6 = false;
      (*pcVar17)(c2m_ctx,pVVar16->size,pVVar16->varr,"binary number is not a standard: %s",pcVar10);
      iStack_8c = 2;
      pcStack_98 = pcVar10 + 2;
    }
  }
  else {
    iStack_8c = 10;
LAB_001921b0:
    bVar18 = 1;
    bVar6 = false;
  }
  uStack_9c = iVar14 - 1;
  uVar11 = 1;
  if (1 < iVar14) {
    uVar11 = sVar20 & 0xffffffff;
  }
  uVar15 = 0;
  bVar8 = false;
  do {
    bVar2 = pcVar10[uVar15];
    if (bVar2 < 0x65) {
      bVar7 = true;
      if ((bVar2 != 0x2e) && (bVar7 = true, bVar2 != 0x50)) {
LAB_00192203:
        bVar7 = bVar8;
        if ((bool)(bVar18 & bVar2 == 0x45)) {
LAB_00192212:
          bVar7 = true;
        }
      }
    }
    else if (bVar2 == 0x65) {
      bVar7 = bVar8;
      if (!bVar6) goto LAB_00192212;
    }
    else {
      bVar7 = true;
      if (bVar2 != 0x70) goto LAB_00192203;
    }
    uVar15 = uVar15 + 1;
    bVar8 = bVar7;
  } while (uVar11 != uVar15);
  if (iVar14 < 3) {
LAB_00192320:
    if (iVar14 == 1) {
LAB_0019232a:
      pcVar19 = pcVar10 + uStack_9c;
      iVar9 = strcmp(pcVar19,"L");
      if ((iVar9 == 0) || (iVar9 = strcmp(pcVar19,"l"), iVar9 == 0)) {
        uStack_9c = iVar14 - 2;
        iStack_a4 = 1;
        bVar8 = false;
        bVar2 = 0;
        iStack_a0 = 0;
        bVar6 = false;
      }
      else {
        iVar9 = strcmp(pcVar19,"U");
        if ((iVar9 == 0) || (iVar9 = strcmp(pcVar19,"u"), iVar9 == 0)) {
          bVar8 = false;
          iStack_a0 = 1;
          bVar2 = 1;
LAB_00192632:
          uStack_9c = iVar14 - 2;
        }
        else {
          if (bVar7) {
            iVar9 = strcmp(pcVar19,"F");
            if ((iVar9 == 0) || (iVar9 = strcmp(pcVar19,"f"), iVar9 == 0)) {
              bVar7 = false;
              bVar8 = true;
              bVar2 = 0;
              iStack_a0 = 0;
              goto LAB_00192632;
            }
            bVar7 = true;
          }
          else {
            bVar7 = false;
          }
          bVar8 = false;
          bVar2 = 0;
          iStack_a0 = 0;
        }
        bVar6 = true;
        iStack_a4 = 0;
      }
    }
    else {
      pcVar19 = pcVar10 + (iVar14 - 2);
      iVar9 = strcmp(pcVar19,"LL");
      if ((iVar9 == 0) || (iVar9 = strcmp(pcVar19,"ll"), iVar9 == 0)) {
        uStack_9c = iVar14 - 3;
        iVar14 = 1;
        bVar6 = true;
        bVar8 = false;
        bVar2 = 0;
        iStack_a0 = 0;
        iStack_a4 = 0;
        bVar18 = 1;
        goto LAB_00192678;
      }
      iVar9 = strcmp(pcVar19,"LU");
      if ((((iVar9 != 0) && (iVar9 = strcmp(pcVar19,"UL"), iVar9 != 0)) &&
          (iVar9 = strcmp(pcVar19,"lu"), iVar9 != 0)) &&
         (((iVar9 = strcmp(pcVar19,"ul"), iVar9 != 0 && (iVar9 = strcmp(pcVar19,"Lu"), iVar9 != 0))
          && ((iVar9 = strcmp(pcVar19,"uL"), iVar9 != 0 &&
              ((iVar9 = strcmp(pcVar19,"lU"), iVar9 != 0 &&
               (iVar9 = strcmp(pcVar19,"Ul"), iVar9 != 0)))))))) goto LAB_0019232a;
      uStack_9c = iVar14 - 3;
      bVar8 = false;
      iStack_a0 = 1;
      bVar2 = 1;
      bVar6 = false;
      iStack_a4 = 1;
    }
    bVar18 = 0;
    iVar14 = 0;
  }
  else {
    pcVar19 = pcVar10 + (iVar14 - 3);
    iVar9 = strcmp(pcVar19,"LLU");
    if (((((iVar9 != 0) && (iVar9 = strcmp(pcVar19,"ULL"), iVar9 != 0)) &&
         (iVar9 = strcmp(pcVar19,"llu"), iVar9 != 0)) &&
        ((iVar9 = strcmp(pcVar19,"ull"), iVar9 != 0 && (iVar9 = strcmp(pcVar19,"LLu"), iVar9 != 0)))
        ) && ((iVar9 = strcmp(pcVar19,"uLL"), iVar9 != 0 &&
              ((iVar9 = strcmp(pcVar19,"llU"), iVar9 != 0 &&
               (iVar9 = strcmp(pcVar19,"Ull"), iVar9 != 0)))))) goto LAB_00192320;
    uStack_9c = iVar14 - 4;
    bVar8 = false;
    iStack_a0 = 1;
    bVar2 = 1;
    bVar6 = true;
    iStack_a4 = 0;
    bVar18 = 1;
    iVar14 = 1;
  }
LAB_00192678:
  if (bVar7) {
    if ((bool)(bVar2 | bVar18)) {
      bVar6 = false;
      error(c2m_ctx,0x1c2e28,(char *)pVVar16->size,pVVar16->varr,pcVar10);
      bVar18 = 1;
    }
    else {
      if (!bVar6) {
        bVar6 = true;
        bVar18 = 0;
        bVar7 = false;
        bVar2 = 1;
        goto LAB_001926d1;
      }
      bVar18 = 1;
      bVar6 = false;
    }
  }
  else {
    bVar6 = true;
    bVar18 = 0;
  }
  bVar7 = true;
  bVar2 = 0;
LAB_001926d1:
  piVar12 = __errno_location();
  *piVar12 = 0;
  if (bVar8) {
    fVar22 = strtof(pcStack_98,(char **)&tStack_78);
    pVar5 = *(pos_t *)&pVVar16->size;
    n = new_node(c2m_ctx,N_F);
    add_pos(c2m_ctx,n,pVar5);
    (n->u).f = fVar22;
  }
  else if (bVar6) {
    if (bVar7) {
      n = get_int_node_from_repr
                    (c2m_ctx,pcStack_98,(char **)&tStack_78,iStack_8c,iStack_a0,iStack_a4,iVar14,
                     *(pos_t *)&pVVar16->size);
    }
    else {
      strtold(pcStack_98,(char **)&tStack_78);
      n = new_ld_node(c2m_ctx,in_ST0,*(pos_t *)&pVVar16->size);
    }
  }
  else {
    dVar23 = strtod(pcStack_98,(char **)&tStack_78);
    pVar5 = *(pos_t *)&pVVar16->size;
    n = new_node(c2m_ctx,N_D);
    add_pos(c2m_ctx,n,pVar5);
    (n->u).d = dVar23;
  }
  pVVar16[1].size = (size_t)n;
  if (tStack_78.str.s == pcVar10 + (long)(int)uStack_9c + 1) {
    if (*piVar12 != 0) {
      if ((bool)(bVar8 | bVar18 | bVar2)) {
        warning(c2m_ctx,0x1c2e43,(char *)pVVar16->size,pVVar16->varr,pVVar16[1].varr);
      }
      else {
        pcVar17 = error;
        if (c2m_ctx->options->pedantic_p == 0) {
          pcVar17 = warning;
        }
        (*pcVar17)(c2m_ctx,pVVar16->size,pVVar16->varr,"number %s is out of range",pVVar16[1].varr);
      }
    }
  }
  else {
    __stream = (FILE *)c2m_ctx->options->message_file;
    if (__stream != (FILE *)0x0) {
      fprintf(__stream,"%s:%s:%s\n",pcVar10);
    }
    error(c2m_ctx,0x1c2e28,(char *)pVVar16->size,pVVar16->varr,pVVar16[1].varr);
  }
  return (char *)pVVar16;
}

Assistant:

static const char *stringify (const char *str, VARR (char) * to) {
  VARR_TRUNC (char, to, 0);
  VARR_PUSH (char, to, '"');
  for (; *str != '\0'; str++) {
    if (*str == '\"' || *str == '\\') VARR_PUSH (char, to, '\\');
    VARR_PUSH (char, to, *str);
  }
  VARR_PUSH (char, to, '"');
  return VARR_ADDR (char, to);
}